

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::Context::~Context(Context *this)

{
  pointer ppIVar1;
  ContextState *pCVar2;
  
  pCVar2 = this->p;
  if (detail::g_cs == pCVar2) {
    detail::g_cs = (ContextState *)0x0;
    pCVar2 = this->p;
  }
  if (pCVar2 != (ContextState *)0x0) {
    std::
    _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
    ::~_Rb_tree(&(pCVar2->subcasesPassed)._M_t);
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::~vector
              (&pCVar2->subcasesStack);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
              (&pCVar2->stringifiedContexts);
    ppIVar1 = (pCVar2->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppIVar1 != (pointer)0x0) {
      operator_delete(ppIVar1,(long)(pCVar2->reporters_currently_used).
                                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppIVar1);
    }
    std::
    vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
    ::~vector(&pCVar2->filters);
    String::~String(&(pCVar2->super_ContextOptions).order_by);
    String::~String(&(pCVar2->super_ContextOptions).out);
    String::~String(&(pCVar2->super_ContextOptions).binary_name);
  }
  operator_delete(pCVar2,0x1160);
  return;
}

Assistant:

Context::~Context() {
    if(g_cs == p)
        g_cs = nullptr;
    delete p;
}